

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

void Ree_ManRemoveContained(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  Vec_Bit_t *p_00;
  int *piVar4;
  int *piVar5;
  int local_28;
  int local_24;
  int k;
  int i;
  Vec_Bit_t *vInsiders;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  p_00 = Ree_CollectInsiders(p,vAdds);
  local_28 = 0;
  local_24 = 0;
  do {
    iVar3 = Vec_IntSize(vAdds);
    if (iVar3 <= local_24 * 6) {
      if (local_24 < local_28) {
        __assert_fail("k <= i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecRe.c"
                      ,0x227,"void Ree_ManRemoveContained(Gia_Man_t *, Vec_Int_t *)");
      }
      Vec_IntShrink(vAdds,local_28 * 6);
      Vec_BitFree(p_00);
      return;
    }
    iVar3 = Vec_IntEntry(vAdds,local_24 * 6 + 2);
    if (iVar3 == 0) {
      iVar3 = Vec_IntEntry(vAdds,local_24 * 6 + 3);
      iVar3 = Vec_BitEntry(p_00,iVar3);
      if (iVar3 == 0) goto LAB_00813815;
      iVar3 = Vec_IntEntry(vAdds,local_24 * 6 + 4);
      iVar3 = Vec_BitEntry(p_00,iVar3);
      if (iVar3 == 0) goto LAB_00813815;
    }
    else {
LAB_00813815:
      piVar4 = Vec_IntArray(vAdds);
      piVar4 = piVar4 + local_28 * 6;
      piVar5 = Vec_IntArray(vAdds);
      piVar5 = piVar5 + local_24 * 6;
      uVar1 = *(undefined8 *)piVar5;
      uVar2 = *(undefined8 *)(piVar5 + 2);
      *(undefined8 *)(piVar4 + 4) = *(undefined8 *)(piVar5 + 4);
      *(undefined8 *)piVar4 = uVar1;
      *(undefined8 *)(piVar4 + 2) = uVar2;
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vInsiders = Ree_CollectInsiders( p, vAdds );
    int i, k = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            if ( Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+3)) && Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+4)) )
                continue;
        memmove( Vec_IntArray(vAdds) + 6*k++, Vec_IntArray(vAdds) + 6*i, 6*sizeof(int) );
    }
    assert( k <= i );
    Vec_IntShrink( vAdds, 6*k );
    Vec_BitFree( vInsiders );
}